

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_cross_trade *m)

{
  iterator iVar1;
  undefined8 uVar2;
  long lVar3;
  uint64_t order_book_id;
  trade t;
  key_type local_78;
  event local_70;
  trade local_30;
  
  local_78 = 0;
  lVar3 = 0;
  while (m->OrderBook[lVar3] == ' ') {
    lVar3 = lVar3 + 1;
    if (lVar3 == 6) goto LAB_001192f2;
  }
  local_78 = 0;
  for (; lVar3 != 6; lVar3 = lVar3 + 1) {
    local_78 = ((long)m->OrderBook[lVar3] + local_78 * 10) - 0x30;
  }
LAB_001192f2:
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,&local_78);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur == (__node_type *)0x0) {
    return;
  }
  local_30.price = 0;
  lVar3 = 0;
  while (m->CrossPrice[lVar3] == ' ') {
    lVar3 = lVar3 + 1;
    if (lVar3 == 10) goto LAB_00119323;
  }
  local_30.price = 0;
  for (; lVar3 != 10; lVar3 = lVar3 + 1) {
    local_30.price = ((long)m->CrossPrice[lVar3] + local_30.price * 10) - 0x30;
  }
LAB_00119323:
  lVar3 = 1;
  local_30.size = 0;
  while (m->Quantity[lVar3 + -1] == ' ') {
    lVar3 = lVar3 + 1;
    if (lVar3 == 10) goto LAB_0011933e;
  }
  local_30.size = 0;
  for (; lVar3 != 10; lVar3 = lVar3 + 1) {
    local_30.size = ((long)m->Quantity[lVar3 + -1] + local_30.size * 10) - 0x30;
  }
LAB_0011933e:
  local_30.timestamp = this->time_sec * 1000 + this->time_msec;
  local_30.sign = crossing;
  make_trade_event(&local_70,
                   (string *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                          ._M_cur + 0x10),local_30.timestamp,&local_30,0);
  if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar2 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._symbol._M_dataplus._M_p != &local_70._symbol.field_2) {
      operator_delete(local_70._symbol._M_dataplus._M_p,
                      local_70._symbol.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar2);
  }
  (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._symbol._M_dataplus._M_p == &local_70._symbol.field_2) {
    return;
  }
  operator_delete(local_70._symbol._M_dataplus._M_p,
                  local_70._symbol.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_cross_trade* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        uint64_t cross_price = itch_uatoi(m->CrossPrice, sizeof(m->CrossPrice));
        uint64_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));
        auto& ob = it->second;
        trade t{timestamp(), cross_price, quantity, trade_sign::crossing};
        _process_event(make_trade_event(ob.symbol(), timestamp(), &t));
    }
}